

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O2

shared_ptr<duckdb::CheckpointLock,_true> __thiscall
duckdb::DuckTransaction::SharedLockTable(DuckTransaction *this,DataTableInfo *info)

{
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_true>
  _Var1;
  pthread_mutex_t *__mutex;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_false,_true>,_bool>
  pVar2;
  shared_ptr<duckdb::CheckpointLock,_true> sVar3;
  unique_lock<std::mutex> transaction_lock;
  undefined1 local_50 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  unique_lock<std::mutex> local_38;
  
  ::std::unique_lock<std::mutex>::unique_lock
            (&local_38,(mutex_type *)&info[1].schema._M_string_length);
  this_00 = &info[1].table.field_2;
  _Var1._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<std::reference_wrapper<duckdb::DataTableInfo>,_std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTableInfo>,_duckdb::ReferenceHashFunction<duckdb::DataTableInfo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::reference_wrapper<duckdb::DataTableInfo>,_std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTableInfo>,_duckdb::ReferenceHashFunction<duckdb::DataTableInfo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)this_00,(key_type *)(local_50 + 8));
  if (_Var1._M_cur == (__node_type *)0x0) {
    make_uniq<duckdb::DuckTransaction::ActiveTableLock>();
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._0_8_;
    local_50._0_8_ =
         (__uniq_ptr_impl<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>_>
          )0x0;
    pVar2 = ::std::
            _Hashtable<std::reference_wrapper<duckdb::DataTableInfo>,std::pair<std::reference_wrapper<duckdb::DataTableInfo>const,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>,std::allocator<std::pair<std::reference_wrapper<duckdb::DataTableInfo>const,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::DataTableInfo>,duckdb::ReferenceHashFunction<duckdb::DataTableInfo>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::pair<duckdb::DataTableInfo&,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>>
                      ((_Hashtable<std::reference_wrapper<duckdb::DataTableInfo>,std::pair<std::reference_wrapper<duckdb::DataTableInfo>const,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>,std::allocator<std::pair<std::reference_wrapper<duckdb::DataTableInfo>const,duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,true>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::DataTableInfo>,duckdb::ReferenceHashFunction<duckdb::DataTableInfo>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)this_00,local_50 + 8);
    _Var1._M_cur = (__node_type *)
                   pVar2.first.
                   super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_true>
                   ._M_cur;
    ::std::
    unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>_>
    ::~unique_ptr((unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>_>
                   *)&local_40);
    ::std::
    unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>_>
    ::~unique_ptr((unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>_>
                   *)local_50);
  }
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>
            ::operator*((unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>
                         *)((long)&((_Var1._M_cur)->
                                   super__Hash_node_value<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::reference_wrapper<duckdb::DataTableInfo>,_duckdb::unique_ptr<duckdb::DuckTransaction::ActiveTableLock,_std::default_delete<duckdb::DuckTransaction::ActiveTableLock>,_true>_>_>
                                   ._M_storage._M_storage + 8));
  ::std::unique_lock<std::mutex>::unlock(&local_38);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  weak_ptr<duckdb::CheckpointLock,_true>::lock((weak_ptr<duckdb::CheckpointLock,_true> *)this);
  if ((this->super_Transaction)._vptr_Transaction == (_func_int **)0x0) {
    StorageLock::GetSharedLock((StorageLock *)local_50);
    make_shared_ptr<duckdb::CheckpointLock,duckdb::unique_ptr<duckdb::StorageLockKey,std::default_delete<duckdb::StorageLockKey>,true>>
              ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                *)(local_50 + 8));
    shared_ptr<duckdb::CheckpointLock,_true>::operator=
              ((shared_ptr<duckdb::CheckpointLock,_true> *)this,
               (shared_ptr<duckdb::CheckpointLock,_true> *)(local_50 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
    ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
                local_50);
    ::std::__weak_ptr<duckdb::CheckpointLock,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<duckdb::CheckpointLock,(__gnu_cxx::_Lock_policy)2> *)&__mutex[1].__data,
               (__shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2> *)this);
  }
  pthread_mutex_unlock(__mutex);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
  sVar3.internal.super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::CheckpointLock,_true>)
         sVar3.internal.super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<CheckpointLock> DuckTransaction::SharedLockTable(DataTableInfo &info) {
	unique_lock<mutex> transaction_lock(active_locks_lock);
	auto entry = active_locks.find(info);
	if (entry == active_locks.end()) {
		entry = active_locks.insert(entry, make_pair(std::ref(info), make_uniq<ActiveTableLock>()));
	}
	auto &active_table_lock = *entry->second;
	transaction_lock.unlock(); // release transaction-level lock before acquiring table-level lock
	lock_guard<mutex> table_lock(active_table_lock.checkpoint_lock_mutex);
	auto checkpoint_lock = active_table_lock.checkpoint_lock.lock();
	// check if it is expired (or has never been acquired yet)
	if (checkpoint_lock) {
		// not expired - return it
		return checkpoint_lock;
	}
	// no existing lock - obtain it
	checkpoint_lock = make_shared_ptr<CheckpointLock>(info.GetSharedLock());
	// store it for future reference
	active_table_lock.checkpoint_lock = checkpoint_lock;
	return checkpoint_lock;
}